

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_outbound_item.c
# Opt level: O0

void nghttp2_outbound_item_free(nghttp2_outbound_item *item,nghttp2_mem *mem)

{
  uint8_t uVar1;
  nghttp2_ext_aux_data *aux_data;
  nghttp2_frame *frame;
  nghttp2_mem *mem_local;
  nghttp2_outbound_item *item_local;
  
  if (item != (nghttp2_outbound_item *)0x0) {
    switch((item->frame).hd.type) {
    case '\0':
      nghttp2_frame_data_free((nghttp2_data *)item);
      break;
    case '\x01':
      nghttp2_frame_headers_free((nghttp2_headers *)item,mem);
      break;
    case '\x02':
      nghttp2_frame_priority_free((nghttp2_priority *)item);
      break;
    case '\x03':
      nghttp2_frame_rst_stream_free((nghttp2_rst_stream *)item);
      break;
    case '\x04':
      nghttp2_frame_settings_free((nghttp2_settings *)item,mem);
      break;
    case '\x05':
      nghttp2_frame_push_promise_free((nghttp2_push_promise *)item,mem);
      break;
    case '\x06':
      nghttp2_frame_ping_free((nghttp2_ping *)item);
      break;
    case '\a':
      nghttp2_frame_goaway_free((nghttp2_goaway *)item,mem);
      break;
    case '\b':
      nghttp2_frame_window_update_free((nghttp2_window_update *)item);
      break;
    default:
      if ((item->aux_data).goaway.flags == '\0') {
        nghttp2_frame_extension_free((nghttp2_extension *)item);
      }
      else {
        uVar1 = (item->frame).hd.type;
        if (uVar1 == '\n') {
          nghttp2_frame_altsvc_free((nghttp2_extension *)item,mem);
        }
        else if (uVar1 == '\f') {
          nghttp2_frame_origin_free((nghttp2_extension *)item,mem);
        }
        else {
          if (uVar1 != '\x10') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_outbound_item.c"
                          ,0x60,
                          "void nghttp2_outbound_item_free(nghttp2_outbound_item *, nghttp2_mem *)")
            ;
          }
          nghttp2_frame_priority_update_free((nghttp2_extension *)item,mem);
        }
      }
    }
  }
  return;
}

Assistant:

void nghttp2_outbound_item_free(nghttp2_outbound_item *item, nghttp2_mem *mem) {
  nghttp2_frame *frame;

  if (item == NULL) {
    return;
  }

  frame = &item->frame;

  switch (frame->hd.type) {
  case NGHTTP2_DATA:
    nghttp2_frame_data_free(&frame->data);
    break;
  case NGHTTP2_HEADERS:
    nghttp2_frame_headers_free(&frame->headers, mem);
    break;
  case NGHTTP2_PRIORITY:
    nghttp2_frame_priority_free(&frame->priority);
    break;
  case NGHTTP2_RST_STREAM:
    nghttp2_frame_rst_stream_free(&frame->rst_stream);
    break;
  case NGHTTP2_SETTINGS:
    nghttp2_frame_settings_free(&frame->settings, mem);
    break;
  case NGHTTP2_PUSH_PROMISE:
    nghttp2_frame_push_promise_free(&frame->push_promise, mem);
    break;
  case NGHTTP2_PING:
    nghttp2_frame_ping_free(&frame->ping);
    break;
  case NGHTTP2_GOAWAY:
    nghttp2_frame_goaway_free(&frame->goaway, mem);
    break;
  case NGHTTP2_WINDOW_UPDATE:
    nghttp2_frame_window_update_free(&frame->window_update);
    break;
  default: {
    nghttp2_ext_aux_data *aux_data;

    aux_data = &item->aux_data.ext;

    if (aux_data->builtin == 0) {
      nghttp2_frame_extension_free(&frame->ext);
      break;
    }

    switch (frame->hd.type) {
    case NGHTTP2_ALTSVC:
      nghttp2_frame_altsvc_free(&frame->ext, mem);
      break;
    case NGHTTP2_ORIGIN:
      nghttp2_frame_origin_free(&frame->ext, mem);
      break;
    case NGHTTP2_PRIORITY_UPDATE:
      nghttp2_frame_priority_update_free(&frame->ext, mem);
      break;
    default:
      assert(0);
      break;
    }
  }
  }
}